

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

int8_t mpack_node_exttype_unchecked(mpack_node_t node)

{
  char *pcVar1;
  mpack_type_t type;
  mpack_node_t node_local;
  
  mpack_node_error(node);
  pcVar1 = mpack_node_data_unchecked(node);
  return pcVar1[-1];
}

Assistant:

MPACK_INLINE int8_t mpack_node_exttype_unchecked(mpack_node_t node) {
    mpack_assert(mpack_node_error(node) == mpack_ok, "tree is in an error state!");

    mpack_type_t type = node.data->type;
    MPACK_UNUSED(type);
    mpack_assert(type == mpack_type_ext, "node of type %i (%s) is not an ext type!",
            type, mpack_type_to_string(type));

    // the exttype of an ext node is stored in the byte preceding the data
    return (int8_t)*(mpack_node_data_unchecked(node) - 1);
}